

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.h
# Opt level: O2

bool __thiscall
vo::OpticalFlowPatch<float,_vo::Pattern51<float>_>::residual
          (OpticalFlowPatch<float,_vo::Pattern51<float>_> *this,Image<const_unsigned_short> *img,
          Matrix2P *transformed_pattern,VectorP *residual)

{
  float fVar1;
  bool bVar2;
  Scalar *pSVar3;
  CoeffReturnType pfVar4;
  int iVar5;
  int i;
  long lVar6;
  int i_1;
  int iVar7;
  float fVar8;
  float local_7c;
  PlainObjectBase<Eigen::Matrix<float,2,1,0,2,1>> local_68 [8];
  MatrixBase<Eigen::Block<const_Eigen::Matrix<float,_2,_52,_0,_2,_52>,_2,_1,_true>_> local_60 [48];
  
  local_7c = 0.0;
  iVar7 = 0;
  for (lVar6 = 0; lVar6 != 0x34; lVar6 = lVar6 + 1) {
    Eigen::Block<const_Eigen::Matrix<float,_2,_52,_0,_2,_52>,_2,_1,_true>::Block
              ((Block<const_Eigen::Matrix<float,_2,_52,_0,_2,_52>,_2,_1,_true> *)local_60,
               transformed_pattern,lVar6);
    bVar2 = Image<unsigned_short_const>::
            InBounds<Eigen::Block<Eigen::Matrix<float,2,52,0,2,52>const,2,1,true>>(img,local_60,2.0)
    ;
    if (bVar2) {
      Eigen::Block<const_Eigen::Matrix<float,_2,_52,_0,_2,_52>,_2,_1,_true>::Block
                ((Block<const_Eigen::Matrix<float,_2,_52,_0,_2,_52>,_2,_1,_true> *)local_60,
                 transformed_pattern,lVar6);
      Eigen::PlainObjectBase<Eigen::Matrix<float,2,1,0,2,1>>::
      PlainObjectBase<Eigen::Block<Eigen::Matrix<float,2,52,0,2,52>const,2,1,true>>
                (local_68,(DenseBase<Eigen::Block<const_Eigen::Matrix<float,_2,_52,_0,_2,_52>,_2,_1,_true>_>
                           *)local_60);
      fVar8 = Image<const_unsigned_short>::interp<float>
                        (img,(Matrix<float,_2,_1,_0,_2,_1> *)local_68);
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>,_1> *)residual,
                          lVar6);
      *pSVar3 = fVar8;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>,_1> *)residual,
                          lVar6);
      local_7c = local_7c + *pSVar3;
      iVar7 = iVar7 + 1;
    }
    else {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>,_1> *)residual,
                          lVar6);
      *pSVar3 = -1.0;
    }
  }
  if (1.1920929e-07 <= local_7c) {
    iVar5 = 0;
    for (lVar6 = 0; lVar6 != 0x34; lVar6 = lVar6 + 1) {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>,_1> *)residual,
                          lVar6);
      if (*pSVar3 < 0.0) {
LAB_0016a961:
        pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>,_1> *)residual,
                            lVar6);
        *pSVar3 = 0.0;
      }
      else {
        pfVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>,_0>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>,_0> *)&this->data
                            ,lVar6);
        if (*pfVar4 < 0.0) goto LAB_0016a961;
        pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>,_1> *)residual,
                            lVar6);
        fVar8 = *pSVar3;
        pfVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>,_0>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>,_0> *)&this->data
                            ,lVar6);
        fVar1 = *pfVar4;
        pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>,_1> *)residual,
                            lVar6);
        *pSVar3 = (fVar8 * (float)iVar7) / local_7c - fVar1;
        iVar5 = iVar5 + 1;
      }
    }
    bVar2 = 0x1a < iVar5;
  }
  else {
    Eigen::DenseBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<float,_52,_1,_0,_52,_1>_> *)residual);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

inline bool residual(const Image<const uint16_t> &img,
                       const Matrix2P &transformed_pattern,
                       VectorP &residual) const {
    Scalar sum = 0;
    int num_valid_points = 0;

    for (int i = 0; i < PATTERN_SIZE; i++) {
      if (img.InBounds(transformed_pattern.col(i), 2)) {
        residual[i] = img.interp<Scalar>(transformed_pattern.col(i));
        sum += residual[i];
        num_valid_points++;
      } else {
        residual[i] = -1;
      }
    }

    // all-black patch cannot be normalized
    if (sum < std::numeric_limits<Scalar>::epsilon()) {
      residual.setZero();
      return false;
    }

    int num_residuals = 0;

    for (int i = 0; i < PATTERN_SIZE; i++) {
      if (residual[i] >= 0 && data[i] >= 0) {
        const Scalar val = residual[i];
        residual[i] = num_valid_points * val / sum - data[i];
        num_residuals++;

      } else {
        residual[i] = 0;
      }
    }

    return num_residuals > PATTERN_SIZE / 2;
  }